

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O3

void __thiscall
r_exec::PrimaryMDLController::abduce_imdl
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  atomic_int_fast64_t *paVar1;
  Sim *pSVar2;
  Goal *this_00;
  Goal *pGVar3;
  Code *actor;
  uint64_t uVar4;
  Fact *pFVar5;
  _GMonitor *m;
  _Fact *p_Var6;
  ostream *poVar7;
  long *plVar8;
  char *local_90;
  long local_88;
  char local_80 [16];
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  _Fact::set_cfd(&f_imdl->super__Fact,confidence);
  this_00 = (Goal *)operator_new(0x160);
  pGVar3 = _Fact::get_goal(&super_goal->super__Fact);
  actor = Goal::get_actor(pGVar3);
  pFVar5 = f_imdl;
  Goal::Goal(this_00,&f_imdl->super__Fact,actor,1.0);
  pSVar2 = (Sim *)(this_00->sim).object;
  if (pSVar2 != sim) {
    if (pSVar2 != (Sim *)0x0) {
      LOCK();
      paVar1 = &(pSVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pSVar2->super__Object)._vptr__Object[1])();
      }
    }
    (this_00->sim).object = &sim->super__Object;
    if (sim != (Sim *)0x0) {
      LOCK();
      paVar1 = &(sim->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  uVar4 = (*Now)();
  pFVar5 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)pFVar5);
  Fact::Fact(pFVar5,(Code *)this_00,uVar4,uVar4,1.0,1.0);
  m = (_GMonitor *)operator_new(200);
  pGVar3 = _Fact::get_goal(&super_goal->super__Fact);
  p_Var6 = Goal::get_target(pGVar3);
  uVar4 = _Fact::get_before(p_Var6);
  RMonitor::RMonitor((RMonitor *)m,this,&bm->super_BindingMap,uVar4,sim->thz,pFVar5,f_imdl);
  PMDLController::add_r_monitor(&this->super_PMDLController,m);
  PMDLController::inject_goal(&this->super_PMDLController,bm,pFVar5,f_imdl);
  poVar7 = _Mem::Output(MDL_OUT);
  (*Now)();
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_50);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  (*((((this->super_PMDLController).super_MDLController.super_HLPController.super_OController.
       super_Controller.view)->object).object)->_vptr__Object[2])();
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," -> ",4);
  (**(code **)((long)(pFVar5->super__Fact).super_LObject.
                     super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                     super__Object._vptr__Object + 0x10))(pFVar5);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," goal imdl ",0xb);
  plVar8 = (long *)(**(code **)((long)(pFVar5->super__Fact).super_LObject.
                                      super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                      super_Code.super__Object._vptr__Object + 0x48))(pFVar5,0);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  (**(code **)(*plVar8 + 0x10))(plVar8);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[",1);
  p_Var6 = Goal::get_target(this_00);
  _Fact::get_after(p_Var6);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_70);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
  p_Var6 = Goal::get_target(this_00);
  _Fact::get_before(p_Var6);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_90);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[\n",2);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void PrimaryMDLController::abduce_imdl(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    f_imdl->set_cfd(confidence);
    Goal *sub_goal = new Goal(f_imdl, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    uint64_t now = Now();
    Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
    add_r_monitor(new RMonitor(this, bm, super_goal->get_goal()->get_target()->get_before(), sim->thz, f_sub_goal, f_imdl)); // the monitor will wait until the deadline of the super-goal.
    inject_goal(bm, f_sub_goal, f_imdl);
    OUTPUT(MDL_OUT) << Utils::RelativeTime(Now()) << " " << getObject()->get_oid() << " -> " << f_sub_goal->get_oid() << " goal imdl " << f_sub_goal->get_reference(0)->get_reference(0)->get_oid() << "[" << Utils::RelativeTime(sub_goal->get_target()->get_after()) << "," << Utils::RelativeTime(sub_goal->get_target()->get_before()) << "[\n";
}